

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  double value;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  anon_union_80_1_493b367e_for_UninterpretedOption_4 aVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar5;
  Symbol SVar6;
  string *psVar7;
  Type type;
  UninterpretedOption *pUVar8;
  ulong uVar9;
  int64_t value_00;
  pointer pcVar10;
  uint64_t uVar11;
  code *pcVar12;
  DescriptorPool *pDVar13;
  size_type sVar14;
  DescriptorBuilder *this_01;
  ulong *puVar15;
  float value_01;
  string_view name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view name_00;
  string_view element_name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  string fully_qualified_name;
  EnumDescriptor *enum_type;
  FieldDescriptor *local_78;
  VoidPtr local_70;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_68;
  long local_60 [2];
  EnumDescriptor **local_50;
  ulong *local_48;
  FieldDescriptor **local_40;
  EnumDescriptor *local_38;
  
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4) - 1U)
  goto LAB_001fc661;
  type = (Type)option_field->type_;
  local_78 = option_field;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4)) {
  case 1:
    pUVar8 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        uVar9 = *(ulong *)((long)&pUVar8->field_0 + 0x40);
        if (-0x80000001 < (long)uVar9) goto LAB_001fc4e7;
        pcVar12 = absl::lts_20240722::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
        ;
LAB_001fc625:
        local_70.obj = &local_78;
        make_error_01.ptr_.obj = &local_70;
        make_error_01.invoker_ = pcVar12;
        bVar3 = AddValueError(this,make_error_01);
        goto LAB_001fc664;
      }
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__2,std::__cxx11::string>
      ;
    }
    else {
      uVar9 = *(ulong *)((long)&pUVar8->field_0 + 0x38);
      if ((uVar9 & 0xffffffff80000000) == 0) {
LAB_001fc4e7:
        SetInt32(this,option_field->number_,(int32_t)uVar9,type,unknown_fields);
        goto LAB_001fc661;
      }
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
      ;
    }
    break;
  case 2:
    pUVar8 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        iVar4 = option_field->number_;
        value_00 = *(int64_t *)((long)&pUVar8->field_0 + 0x40);
LAB_001fc500:
        SetInt64(this,iVar4,value_00,type,unknown_fields);
        goto LAB_001fc661;
      }
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__4,std::__cxx11::string>
      ;
    }
    else {
      value_00 = *(long *)((long)&pUVar8->field_0 + 0x38);
      if (-1 < value_00) {
        iVar4 = option_field->number_;
        goto LAB_001fc500;
      }
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,std::__cxx11::string>
      ;
    }
    break;
  case 3:
    pUVar8 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x8) ==
        (undefined1  [80])0x0) {
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__6,std::__cxx11::string>
      ;
    }
    else {
      uVar9 = *(ulong *)((long)&pUVar8->field_0 + 0x38);
      if (uVar9 >> 0x20 == 0) {
        SetUInt32(this,option_field->number_,(uint32_t)uVar9,type,unknown_fields);
        goto LAB_001fc661;
      }
      this_01 = this->builder_;
      pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__5,std::__cxx11::string>
      ;
    }
    break;
  case 4:
    pUVar8 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x8) !=
        (undefined1  [80])0x0) {
      SetUInt64(this,option_field->number_,*(uint64_t *)((long)&pUVar8->field_0 + 0x38),type,
                unknown_fields);
      goto LAB_001fc661;
    }
    this_01 = this->builder_;
    pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
    ;
    break;
  case 5:
    pUVar8 = this->uninterpreted_option_;
    aVar1 = pUVar8->field_0;
    if (((undefined1  [80])aVar1 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar1 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar1 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar8->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc));
          if (iVar4 == 0) {
            value = INFINITY;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc));
            if (iVar4 != 0) {
              pcVar12 = absl::lts_20240722::functional_internal::
                        InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__9,std::__cxx11::string>
              ;
              goto LAB_001fc625;
            }
            value = NAN;
          }
        }
        else {
          value = (double)(pUVar8->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar11 = (pUVar8->field_0)._impl_.positive_int_value_;
        value = ((double)CONCAT44(0x45300000,(int)(uVar11 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      }
    }
    else {
      value = (pUVar8->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed64(unknown_fields,option_field->number_,(uint64_t)value);
    goto LAB_001fc661;
  case 6:
    pUVar8 = this->uninterpreted_option_;
    aVar1 = pUVar8->field_0;
    if (((undefined1  [80])aVar1 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar1 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar1 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar8->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc));
          if (iVar4 == 0) {
            value_01 = INFINITY;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc));
            if (iVar4 != 0) {
              pcVar12 = absl::lts_20240722::functional_internal::
                        InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__8,std::__cxx11::string>
              ;
              goto LAB_001fc625;
            }
            value_01 = NAN;
          }
        }
        else {
          value_01 = (float)(pUVar8->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar9 = (pUVar8->field_0)._impl_.positive_int_value_;
        if ((long)uVar9 < 0) {
          value_01 = (float)uVar9;
        }
        else {
          value_01 = (float)(long)uVar9;
        }
      }
    }
    else {
      value_01 = (float)(pUVar8->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed32(unknown_fields,option_field->number_,(uint32_t)value_01);
LAB_001fc661:
    bVar3 = 1;
    goto LAB_001fc664;
  case 7:
    pUVar8 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((ulong)(pUVar8->field_0)._impl_.identifier_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc));
      if (iVar4 == 0) {
        uVar11 = 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                           identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
        ;
        if (iVar4 != 0) {
          pcVar12 = absl::lts_20240722::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__11,std::__cxx11::string>
          ;
          goto LAB_001fc625;
        }
        uVar11 = 0;
      }
      iVar4 = option_field->number_;
LAB_001fc603:
      UnknownFieldSet::AddVarint(unknown_fields,iVar4,uVar11);
      goto LAB_001fc661;
    }
    this_01 = this->builder_;
    pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,std::__cxx11::string>
    ;
    break;
  case 8:
    pUVar8 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      this_00 = FieldDescriptor::enum_type(option_field);
      puVar15 = (ulong *)((ulong)(this->uninterpreted_option_->field_0)._impl_.identifier_value_.
                                 tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      pDVar13 = this_00->file_->pool_;
      local_38 = this_00;
      pDVar5 = DescriptorPool::internal_generated_pool();
      DescriptorProto::GetMetadata((DescriptorProto *)&_DescriptorProto_default_instance_);
      pb::CppFeatures::GetMetadata((CppFeatures *)&pb::_CppFeatures_default_instance_);
      if (pDVar13 == pDVar5) {
        name_00._M_str = (char *)*puVar15;
        name_00._M_len = puVar15[1];
        SVar6.ptr_ = (SymbolBase *)EnumDescriptor::FindValueByName(this_00,name_00);
      }
      else {
        local_70.obj = local_60;
        pcVar10 = this_00->all_names_[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar10,pcVar10 + this_00->all_names_[1]._M_string_length);
        std::__cxx11::string::resize
                  ((ulong)&local_70,(char)p_Stack_68 - (char)this_00->all_names_->_M_string_length);
        std::__cxx11::string::_M_append((char *)&local_70,*puVar15);
        name._M_str = (char *)local_70.obj;
        name._M_len = (size_t)p_Stack_68;
        SVar6 = FindSymbolNotEnforcingDeps(this->builder_,name,true);
        bVar2 = true;
        if ((SVar6.ptr_)->symbol_type_ == '\x05') {
LAB_001fc34e:
          if (((EnumValueDescriptor *)SVar6.ptr_)->type_ != this_00) {
            local_50 = &local_38;
            local_40 = &local_78;
            make_error_00.invoker_ =
                 absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = &local_50;
            local_48 = puVar15;
            bVar2 = AddValueError(this,make_error_00);
            pDVar13 = (DescriptorPool *)(ulong)bVar2;
            SVar6.ptr_ = (SymbolBase *)0x0;
            bVar2 = false;
          }
        }
        else {
          if ((SVar6.ptr_)->symbol_type_ == '\x06') {
            SVar6.ptr_ = SVar6.ptr_ + -1;
            goto LAB_001fc34e;
          }
          SVar6.ptr_ = (SymbolBase *)0x0;
        }
        bVar3 = (byte)pDVar13;
        if ((long *)local_70.obj != local_60) {
          operator_delete(local_70.obj,local_60[0] + 1);
        }
        if (!bVar2) goto LAB_001fc664;
      }
      if ((EnumValueDescriptor *)SVar6.ptr_ == (EnumValueDescriptor *)0x0) {
        pcVar12 = absl::lts_20240722::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
        ;
        p_Stack_68 = (Invoker<std::__cxx11::basic_string<char>_>)puVar15;
        goto LAB_001fc625;
      }
      iVar4 = local_78->number_;
      uVar11 = (uint64_t)((EnumValueDescriptor *)SVar6.ptr_)->number_;
      goto LAB_001fc603;
    }
    this_01 = this->builder_;
    pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__12,std::__cxx11::string>
    ;
    break;
  case 9:
    pUVar8 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar8->field_0 & (undefined1  [80])0x2) !=
        (undefined1  [80])0x0) {
      uVar9 = *(ulong *)((ulong)(pUVar8->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc);
      psVar7 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,option_field->number_);
      std::__cxx11::string::_M_replace((ulong)psVar7,0,(char *)psVar7->_M_string_length,uVar9);
      goto LAB_001fc661;
    }
    this_01 = this->builder_;
    pcVar10 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar14 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__15,std::__cxx11::string>
    ;
    break;
  case 10:
    bVar2 = SetAggregateOption(this,option_field,unknown_fields);
    if (bVar2) goto LAB_001fc661;
    goto LAB_001fc582;
  }
  local_50 = (EnumDescriptor **)&local_78;
  local_70.obj = &local_50;
  make_error.invoker_ = p_Stack_68;
  make_error.ptr_.obj = local_70.obj;
  element_name._M_str = pcVar10;
  element_name._M_len = sVar14;
  AddError(this_01,element_name,&pUVar8->super_Message,OPTION_VALUE,make_error);
LAB_001fc582:
  bVar3 = 0;
LAB_001fc664:
  return (bool)(bVar3 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int32_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64_t>(std::numeric_limits<int32_t>::min())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int32_t>("int32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int64_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int64_t>("int64", option_field->full_name());
          });
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int64_t>("int64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            std::numeric_limits<uint32_t>::max()) {
          return AddValueError([&] {
            return ValueOutOfRange<uint32_t>("uint32",
                                             option_field->full_name());
          });
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint32_t>("uint32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint64_t>("uint64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<float>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<float>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for float option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<double>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<double>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for double option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64_t value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat("Value must be identifier for boolean option \"",
                              option_field->full_name(), "\".");
        });
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be \"true\" or \"false\" for boolean option \"",
              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be identifier for enum-valued option \"",
              option_field->full_name(), "\".");
        });
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = std::string(enum_type->full_name());
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (auto* candidate_descriptor = symbol.enum_value_descriptor()) {
          if (candidate_descriptor->type() != enum_type) {
            return AddValueError([&] {
              return absl::StrCat(
                  "Enum type \"", enum_type->full_name(),
                  "\" has no value named \"", value_name, "\" for option \"",
                  option_field->full_name(),
                  "\". This appears to be a value from a sibling type.");
            });
          } else {
            enum_value = candidate_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError([&] {
          return absl::StrCat(
              "Enum type \"", option_field->enum_type()->full_name(),
              "\" has no value named \"", value_name, "\" for option \"",
              option_field->full_name(), "\".");
        });
      } else {
        // Sign-extension is not a problem, since we cast directly from int32_t
        // to uint64_t, without first going through uint32_t.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64_t>(static_cast<int64_t>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be quoted string for string option \"",
              option_field->full_name(), "\".");
        });
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}